

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  llama_sampler *plVar2;
  allocator_type *__a;
  int top_k;
  int top_k_00;
  int top_k_01;
  int top_k_02;
  int top_k_03;
  int top_k_04;
  int top_k_05;
  int top_k_06;
  int top_k_07;
  int top_k_08;
  int top_k_09;
  int top_k_10;
  int top_k_11;
  int top_k_12;
  int top_k_13;
  int top_k_14;
  int top_k_15;
  int top_k_16;
  int top_k_17;
  int top_k_18;
  int top_k_19;
  int top_k_20;
  int top_k_21;
  int top_k_22;
  int i;
  int iVar3;
  float p;
  float p_00;
  float in_XMM1_Da;
  float dry_base;
  float in_XMM2_Da;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  initializer_list<float> __l_12;
  initializer_list<float> __l_13;
  initializer_list<float> __l_14;
  initializer_list<float> __l_15;
  initializer_list<float> __l_16;
  initializer_list<float> __l_17;
  initializer_list<float> __l_18;
  initializer_list<float> __l_19;
  initializer_list<float> __l_20;
  initializer_list<float> __l_21;
  initializer_list<float> __l_22;
  initializer_list<float> __l_23;
  initializer_list<float> __l_24;
  initializer_list<float> __l_25;
  initializer_list<float> __l_26;
  initializer_list<float> __l_27;
  initializer_list<float> __l_28;
  initializer_list<float> __l_29;
  initializer_list<float> __l_30;
  initializer_list<float> __l_31;
  initializer_list<float> __l_32;
  initializer_list<float> __l_33;
  initializer_list<float> __l_34;
  initializer_list<float> __l_35;
  initializer_list<float> __l_36;
  initializer_list<float> __l_37;
  initializer_list<float> __l_38;
  initializer_list<float> __l_39;
  initializer_list<float> __l_40;
  initializer_list<float> __l_41;
  initializer_list<float> __l_42;
  initializer_list<float> __l_43;
  initializer_list<float> __l_44;
  initializer_list<float> __l_45;
  initializer_list<float> __l_46;
  initializer_list<float> __l_47;
  initializer_list<float> __l_48;
  initializer_list<float> __l_49;
  initializer_list<float> __l_50;
  initializer_list<float> __l_51;
  initializer_list<int> __l_52;
  initializer_list<float> __l_53;
  initializer_list<float> __l_54;
  initializer_list<int> __l_55;
  initializer_list<float> __l_56;
  initializer_list<float> __l_57;
  initializer_list<int> __l_58;
  initializer_list<float> __l_59;
  initializer_list<float> __l_60;
  initializer_list<int> __l_61;
  initializer_list<float> __l_62;
  initializer_list<float> __l_63;
  initializer_list<int> __l_64;
  initializer_list<float> __l_65;
  initializer_list<float> __l_66;
  initializer_list<int> __l_67;
  initializer_list<float> __l_68;
  initializer_list<float> __l_69;
  initializer_list<int> __l_70;
  initializer_list<float> __l_71;
  initializer_list<float> __l_72;
  initializer_list<int> __l_73;
  initializer_list<float> __l_74;
  initializer_list<float> __l_75;
  initializer_list<int> __l_76;
  initializer_list<float> __l_77;
  initializer_list<int> __l_78;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_79;
  initializer_list<float> __l_80;
  initializer_list<int> __l_81;
  initializer_list<float> __l_82;
  initializer_list<float> __l_83;
  initializer_list<int> __l_84;
  initializer_list<float> __l_85;
  initializer_list<float> __l_86;
  initializer_list<float> __l_87;
  initializer_list<float> __l_88;
  initializer_list<float> __l_89;
  initializer_list<float> __l_90;
  initializer_list<float> __l_91;
  vector<llama_token_data,_std::allocator<llama_token_data>_> data;
  undefined1 local_f8 [8];
  float local_f0;
  allocator_type local_d9;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  int local_bc;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  _Vector_base<int,_std::allocator<int>_> local_78;
  allocator_type local_5c;
  allocator_type local_5b;
  allocator_type local_5a;
  allocator_type local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  ggml_time_init();
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_00,(allocator_type *)&local_78);
  test_temp((vector<float,_std::allocator<float>_> *)&data,
            (vector<float,_std::allocator<float>_> *)local_f8,1.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_01,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_02,(allocator_type *)&local_78);
  test_temp((vector<float,_std::allocator<float>_> *)&data,
            (vector<float,_std::allocator<float>_> *)local_f8,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_03,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_04,(allocator_type *)&local_78);
  test_temp_ext((vector<float,_std::allocator<float>_> *)&data,
                (vector<float,_std::allocator<float>_> *)local_f8,1.0,in_XMM1_Da,in_XMM2_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_05,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_06,(allocator_type *)&local_78);
  test_temp_ext((vector<float,_std::allocator<float>_> *)&data,
                (vector<float,_std::allocator<float>_> *)local_f8,0.0,in_XMM1_Da,in_XMM2_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_07,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_08,(allocator_type *)&local_78);
  test_top_k((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,1);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_09,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3eaaaa3b3ee38da4;
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3e638da4);
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_10,(allocator_type *)&local_78);
  test_top_k((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,3);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_11,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_12._M_len = 4;
  __l_12._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_12,(allocator_type *)&local_78);
  test_top_k((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,4);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_13,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_14._M_len = 4;
  __l_14._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_14,(allocator_type *)&local_78);
  test_top_k((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_15,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_16,(allocator_type *)&local_78);
  test_top_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_17._M_len = 4;
  __l_17._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_17,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3edb6da83f12492c;
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_18,(allocator_type *)&local_78);
  test_top_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.7);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_19._M_len = 4;
  __l_19._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_19,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3eaaaa3b3ee38da4;
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3e638da4);
  __l_20._M_len = 3;
  __l_20._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_20,(allocator_type *)&local_78);
  test_top_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_21._M_len = 4;
  __l_21._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_21,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_22._M_len = 4;
  __l_22._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_22,(allocator_type *)&local_78);
  test_top_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,1.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_23._M_len = 4;
  __l_23._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_23,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_24._M_len = 4;
  __l_24._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_24,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_25._M_len = 4;
  __l_25._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_25,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_26._M_len = 4;
  __l_26._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_26,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.24);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_27._M_len = 4;
  __l_27._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_27,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3eaaaaab3ee38e3a;
  local_b8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e638e3a;
  __l_28._M_len = 3;
  __l_28._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_28,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.26);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_29._M_len = 4;
  __l_29._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_29,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3eaaaaab3ee38e3a;
  local_b8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e638e3a;
  __l_30._M_len = 3;
  __l_30._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_30,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.49);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_31._M_len = 4;
  __l_31._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_31,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3edb6db83f124925;
  __l_32._M_len = 2;
  __l_32._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_32,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.51);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_33._M_len = 4;
  __l_33._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_33,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3edb6db83f124925;
  __l_34._M_len = 2;
  __l_34._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_34,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.74);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_35._M_len = 4;
  __l_35._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_35,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
  __l_36._M_len = 1;
  __l_36._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_36,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,0.76);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_37._M_len = 4;
  __l_37._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_37,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
  __l_38._M_len = 1;
  __l_38._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_38,(allocator_type *)&local_78);
  test_min_p((vector<float,_std::allocator<float>_> *)&data,
             (vector<float,_std::allocator<float>_> *)local_f8,1.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  puts("XTC should:");
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_39._M_len = 4;
  __l_39._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_39,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_start._4_4_,0x3dcccccd);
  __l_40._M_len = 1;
  __l_40._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_40,(allocator_type *)&local_78);
  test_xtc((vector<float,_std::allocator<float>_> *)&data,
           (vector<float,_std::allocator<float>_> *)local_f8,0.09,in_XMM1_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_41._M_len = 4;
  __l_41._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_41,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3dcccccd3e4ccccd;
  __l_42._M_len = 2;
  __l_42._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_42,(allocator_type *)&local_78);
  test_xtc((vector<float,_std::allocator<float>_> *)&data,
           (vector<float,_std::allocator<float>_> *)local_f8,0.19,in_XMM1_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_43._M_len = 4;
  __l_43._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_43,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e99999a;
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3dcccccd);
  __l_44._M_len = 3;
  __l_44._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_44,(allocator_type *)&local_78);
  test_xtc((vector<float,_std::allocator<float>_> *)&data,
           (vector<float,_std::allocator<float>_> *)local_f8,0.29,in_XMM1_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  puts("XTC should not:");
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_45._M_len = 4;
  __l_45._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_45,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __l_46._M_len = 4;
  __l_46._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_46,(allocator_type *)&local_78);
  test_xtc((vector<float,_std::allocator<float>_> *)&data,
           (vector<float,_std::allocator<float>_> *)local_f8,0.39,in_XMM1_Da);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3c23d70a3f7851ec;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3c23d70a3c23d70a;
  __l_47._M_len = 4;
  __l_47._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_47,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f7851ec);
  __l_48._M_len = 1;
  __l_48._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_48,(allocator_type *)&local_78);
  test_typical((vector<float,_std::allocator<float>_> *)&data,
               (vector<float,_std::allocator<float>_> *)local_f8,p);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3ecccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  __l_49._M_len = 4;
  __l_49._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_49,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3e4ccccd);
  __l_50._M_len = 3;
  __l_50._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_50,(allocator_type *)&local_78);
  test_typical((vector<float,_std::allocator<float>_> *)&data,
               (vector<float,_std::allocator<float>_> *)local_f8,p_00);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_51._M_len = 5;
  __l_51._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_51,(allocator_type *)&local_38);
  local_78._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  __l_52._M_len = 1;
  __l_52._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_52,(allocator_type *)&local_58);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e800000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e8000003e800000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_53._M_len = 5;
  __l_53._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_53,(allocator_type *)&local_bc);
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,50.0,0.0,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_54._M_len = 5;
  __l_54._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_54,(allocator_type *)&local_38);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_78._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_finish._4_4_,2);
  __l_55._M_len = 3;
  __l_55._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_55,(allocator_type *)&local_58);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f000000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_56._M_len = 5;
  __l_56._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_56,(allocator_type *)&local_bc);
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,50.0,0.0,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_57._M_len = 5;
  __l_57._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_57,(allocator_type *)&local_38);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_58._M_len = 5;
  __l_58._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_58,(allocator_type *)&local_58);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f000000;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_59._M_len = 5;
  __l_59._M_array = (iterator)&local_78;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_59,(allocator_type *)&local_bc);
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,50.0,0.0,0.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_60._M_len = 5;
  __l_60._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_60,(allocator_type *)&local_38);
  local_78._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  __l_61._M_len = 1;
  __l_61._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_61,(allocator_type *)&local_58);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e7fff373e7fff37;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e7fff373e7fff37;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x37388ca4;
  __l_62._M_len = 5;
  __l_62._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_62,(allocator_type *)&local_bc);
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,1.0,5.0,5.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_63._M_len = 5;
  __l_63._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_63,(allocator_type *)&local_38);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_78._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_finish._4_4_,2);
  __l_64._M_len = 3;
  __l_64._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_64,(allocator_type *)&local_58);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3efffb8b3efffb8b;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x37c0f02037c0f020;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x37c0f020;
  __l_65._M_len = 5;
  __l_65._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_65,(allocator_type *)&local_bc);
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,1.0,5.0,5.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3e4ccccd
                        );
  __l_66._M_len = 5;
  __l_66._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_66,(allocator_type *)&local_38);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_67._M_len = 5;
  __l_67._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_67,(allocator_type *)&local_58);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x3efffcfc3efffcfc;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x37c0f02037c0f020;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __l_68._M_len = 5;
  __l_68._M_array = (iterator)&local_78;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_68,(allocator_type *)&local_bc);
  dry_base = 5.0;
  test_penalties((vector<float,_std::allocator<float>_> *)&data,
                 (vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<float,_std::allocator<float>_> *)&local_d8,1.0,5.0,5.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e800000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e8000003e800000;
  __l_69._M_len = 4;
  __l_69._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_69,(allocator_type *)&local_58);
  local_38 = 0x100000000;
  __l_70._M_len = 2;
  __l_70._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_70,(allocator_type *)&local_bc);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e800000;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e8000003e800000;
  __l_71._M_len = 4;
  __l_71._M_array = (iterator)&local_78;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_71,&local_d9);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_dry((vector<float,_std::allocator<float>_> *)&data,
           (vector<int,_std::allocator<int>_> *)local_f8,
           (vector<float,_std::allocator<float>_> *)&local_d8,1.0,dry_base,2,4,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e800000;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e8000003e800000;
  __l_72._M_len = 4;
  __l_72._M_array = (iterator)&local_78;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_72,(allocator_type *)&local_58);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  __l_73._M_len = 5;
  __l_73._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_73,(allocator_type *)&local_bc);
  local_38 = 0x3e98064b3e98064b;
  uStack_30 = 0x3ddfb5073e98064b;
  __l_74._M_len = 4;
  __l_74._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_74,&local_d9);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_dry((vector<float,_std::allocator<float>_> *)&data,
           (vector<int,_std::allocator<int>_> *)local_f8,
           (vector<float,_std::allocator<float>_> *)&local_d8,1.0,dry_base,2,5,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_38 = 0x3e4ccccd3e4ccccd;
  uStack_30 = 0x3e4ccccd3e4ccccd;
  local_28 = 0x3e4ccccd;
  __l_75._M_len = 5;
  __l_75._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_75,&local_d9);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000003;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
  __l_76._M_len = 6;
  __l_76._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_76,&local_59);
  local_58 = 0x3e4ccccd3e4ccccd;
  uStack_50 = 0x3e4ccccd3e4ccccd;
  local_48 = 0x3e4ccccd;
  __l_77._M_len = 5;
  __l_77._M_array = (iterator)&local_58;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b8,__l_77,&local_5a);
  local_bc = 3;
  __l_78._M_len = 1;
  __l_78._M_array = &local_bc;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,__l_78,&local_5b);
  __l_79._M_len = 1;
  __l_79._M_array = (iterator)&local_78;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_98,__l_79,&local_5c);
  test_dry((vector<float,_std::allocator<float>_> *)&data,
           (vector<int,_std::allocator<int>_> *)local_f8,
           (vector<float,_std::allocator<float>_> *)&local_b8,1.0,dry_base,2,6,&local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_98.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3e4ccccd);
  __l_80._M_len = 5;
  __l_80._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_80,(allocator_type *)&local_58);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  __l_81._M_len = 5;
  __l_81._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_81,(allocator_type *)&local_bc);
  local_38 = 0x3e779f233e779f23;
  uStack_30 = 0x3e779f233e779f23;
  local_28 = 0x3d060cbf;
  __l_82._M_len = 5;
  __l_82._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d8,__l_82,&local_d9);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_dry((vector<float,_std::allocator<float>_> *)&data,
           (vector<int,_std::allocator<int>_> *)local_f8,
           (vector<float,_std::allocator<float>_> *)&local_d8,2.0,dry_base,2,5,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3e4ccccd;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e4ccccd3e4ccccd;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3e4ccccd;
  __l_83._M_len = 5;
  __l_83._M_array = (iterator)&local_78;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_83,(allocator_type *)&local_58);
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000000;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 2;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 3;
  __l_84._M_len = 7;
  __l_84._M_array = (iterator)&data;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d8,__l_84,(allocator_type *)&local_bc);
  local_38 = 0x3e4ccccd3e4ccccd;
  uStack_30 = 0x3e4ccccd3e4ccccd;
  local_28 = 0x3e4ccccd;
  __l_85._M_len = 5;
  __l_85._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b8,__l_85,&local_d9);
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_dry((vector<float,_std::allocator<float>_> *)local_f8,
           (vector<int,_std::allocator<int>_> *)&local_d8,
           (vector<float,_std::allocator<float>_> *)&local_b8,1.0,dry_base,4,7,&local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_86._M_len = 4;
  __l_86._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_86,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3edb6da83f12492c;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_87._M_len = 4;
  __l_87._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_87,(allocator_type *)&local_78);
  test_top_n_sigma((vector<float,_std::allocator<float>_> *)&data,
                   (vector<float,_std::allocator<float>_> *)local_f8,1);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_88._M_len = 4;
  __l_88._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_88,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_89._M_len = 4;
  __l_89._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_89,(allocator_type *)&local_78);
  test_top_n_sigma((vector<float,_std::allocator<float>_> *)&data,
                   (vector<float,_std::allocator<float>_> *)local_f8,0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ecccccd3e99999a;
  __l_90._M_len = 4;
  __l_90._M_array = (iterator)&local_d8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&data,__l_90,(allocator_type *)&local_98);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e99999a3ecccccd;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd3e4ccccd;
  __a = (allocator_type *)&local_78;
  __l_91._M_len = 4;
  __l_91._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,__l_91,__a);
  test_top_n_sigma((vector<float,_std::allocator<float>_> *)&data,
                   (vector<float,_std::allocator<float>_> *)local_f8,3);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"k",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k,1.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"k",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x1,top_k_00,1.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"p",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_01,1.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"p",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_02,0.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"m",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_03,1.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"m",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_04,1.0,1e-12);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"k",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_05,1.0,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"p",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_06,0.0002,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"p",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_07,0.8,1.0);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"m",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_08,1.0,0.99989);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"m",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x2710,top_k_09,1.0,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"kp",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_10,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"km",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_11,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"pk",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_12,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"pm",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_13,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"mk",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_14,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"mp",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_15,0.8,0.99989);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"mp",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_16,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"kpm",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_17,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"kmp",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_18,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"pkm",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_19,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"pmk",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_20,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"mkp",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_21,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"mpk",(allocator<char> *)local_f8);
  test_sampler_queue((size_t)&data,(string *)0x64,top_k_22,0.8,0.1);
  std::__cxx11::string::~string((string *)&data);
  puts("OK");
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve(&data,0x20000);
  for (iVar3 = 0; iVar1 = (int)__a, iVar3 != 0x20000; iVar3 = iVar3 + 1) {
    iVar1 = rand();
    local_f8._4_4_ = (float)iVar1 / 2.1474836e+09 + -0.5;
    local_f8._4_4_ = (float)local_f8._4_4_ + (float)local_f8._4_4_;
    local_f0 = 0.0;
    local_f8._0_4_ = iVar3;
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::emplace_back<llama_token_data>
              (&data,(llama_token_data *)local_f8);
  }
  plVar2 = (llama_sampler *)llama_sampler_init_top_k(0x28);
  bench(plVar2,"llama_sampler_init_top_k (40)",&data,iVar1);
  plVar2 = (llama_sampler *)llama_sampler_init_top_p(0x3f4ccccd,1);
  bench(plVar2,"llama_sampler_init_top_p (0.8f, 1)",&data,iVar1);
  plVar2 = (llama_sampler *)llama_sampler_init_min_p(0x3e4ccccd,1);
  bench(plVar2,"llama_sampler_init_min_p (0.2f, 1)",&data,iVar1);
  plVar2 = (llama_sampler *)llama_sampler_init_typical(0x3f000000,1);
  bench(plVar2,"llama_sampler_init_typical(0.5f, 1)",&data,iVar1);
  plVar2 = (llama_sampler *)llama_sampler_init_xtc(0x3f800000,0x3dcccccd,1,1);
  bench(plVar2,"llama_sampler_init_xtc (1.0f, 0.1f, 1, 1)",&data,iVar1);
  std::_Vector_base<llama_token_data,_std::allocator<llama_token_data>_>::~_Vector_base
            (&data.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>);
  return 0;
}

Assistant:

int main(void) {
    ggml_time_init();

    test_temp({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f);
    test_temp({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.0f);

    test_temp_ext({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f, 0.0f, 1.0f);
    test_temp_ext({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.0f, 0.0f, 1.0f);

    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f}, 1);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.44444f, 0.33333f, 0.22222f}, 3);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 4);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 0);

    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f}, 0);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.571429f, 0.428571f}, 0.7f);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.44444f, 0.33333f, 0.22222f}, 0.8f);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f);

    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/1.0f, 0.3f/1.0f, 0.2f/1.0f, 0.1f/1.0f}, 0.00f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/1.0f, 0.3f/1.0f, 0.2f/1.0f, 0.1f/1.0f}, 0.24f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.9f, 0.3f/0.9f, 0.2f/0.9f},            0.26f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.9f, 0.3f/0.9f, 0.2f/0.9f},            0.49f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.7f, 0.3f/0.7f},                       0.51f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.7f, 0.3f/0.7f},                       0.74f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.4f},                                  0.76f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.4f},                                  1.00f);

    printf("XTC should:\n");
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.1f},                                0.99f, 0.09f);
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.2f, 0.1f},                          0.99f, 0.19f);
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.3f, 0.2f, 0.1f},                    0.99f, 0.29f);

    printf("XTC should not:\n");
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.4f, 0.3f, 0.2f, 0.1f},              0.99f, 0.39f);

    test_typical({0.97f, 0.01f, 0.01f, 0.01f}, {0.97f}, 0.5f);
    test_typical({0.4f, 0.2f, 0.2f, 0.2f}, {0.2f, 0.2f, 0.2f}, 0.5f);

    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0}, {0.25f, 0.25f, 0.25f, 0.25f, 0},   50.0f, 0.0f, 0.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2}, {0.5f, 0.5f, 0, 0, 0},       50.0f, 0.0f, 0.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 0}, {0.5f, 0.5f, 0, 0, 0}, 50.0f, 0.0f, 0.0f);

    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0},             {0.249997f, 0.249997f, 0.249997f, 0.249997f, 0.000011f}, 1.0f, 5.0f, 5.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2},       {0.499966f, 0.499966f, 0.000023f, 0.000023f, 0.000023f}, 1.0f, 5.0f, 5.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 0}, {0.499977f, 0.499977f, 0.000023f, 0.000023f, 0.000000f}, 1.0f, 5.0f, 5.0f);


    test_dry({0.25f, 0.25f, 0.25f, 0.25f}, {0, 1}, {0.25f, 0.25f, 0.25f, 0.25f}, 1.0f, 1.1f, 2, 4, {});
    test_dry({0.25f, 0.25f, 0.25f, 0.25f}, {0, 1, 2, 0, 1}, {0.296923f, 0.296923f, 0.296923f, 0.109232f}, 1.0f, 1.1f, 2, 5, {});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 3, 4, 0, 1}, {0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, 1.0f, 1.1f, 2, 6, {{3}});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 1}, {0.241818f, 0.241818f, 0.241818f, 0.241818f, 0.032727f}, 2.0f, 1.1f, 2, 5, {});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 3, 4, 0, 1}, {0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, 1.0f, 1.1f, 4, 7, {});

    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {0.571429f, 0.428571f, 0.0f, 0.0f}, 1.00f);
    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.00f);
    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 3.00f);

    test_sampler_queue(10000, "k", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "k",     1, 1.0f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.0f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0f, 1e-12);

    test_sampler_queue(10000, "k",   100, 1.0000f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.0002f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.8000f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0000f, 9997.9f/9999.0f);
    test_sampler_queue(10000, "m", 10000, 1.0000f, 0.1f);

    test_sampler_queue(10000, "kp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "km", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mp", 100, 0.8f, 9997.9f/9999.0f);
    test_sampler_queue(10000, "mp", 100, 0.8f, 0.1f);

    test_sampler_queue(10000, "kpm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "kmp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pkm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pmk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mkp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mpk", 100, 0.8f, 0.1f);

    printf("OK\n");

    test_perf();

    return 0;
}